

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O2

void __thiscall Am_Style_Data::~Am_Style_Data(Am_Style_Data *this)

{
  Display *pDVar1;
  Color_Index *pCVar2;
  undefined8 uVar3;
  Color_Index *pCVar4;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb6d8;
  if ((this->color_name != (char *)0x0) && (this->color_allocated == true)) {
    operator_delete__(this->color_name);
  }
  if (this->dash_list != (char *)0x0) {
    operator_delete__(this->dash_list);
  }
  pDVar1 = this->main_display;
  if ((pDVar1 != (Display *)0x0) && (this->color_allocated == true)) {
    uVar3 = XDefaultColormap(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
    XFreeColors(this->main_display,uVar3,&this->main_color,1,0);
  }
  pCVar4 = this->color_head;
  while (pCVar4 != (Color_Index *)0x0) {
    pDVar1 = pCVar4->dpy;
    pCVar2 = pCVar4->next;
    pCVar4->next = (Color_Index *)0x0;
    if ((pDVar1 != (Display *)0x0) && (this->color_allocated == true)) {
      uVar3 = XDefaultColormap(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
      XFreeColors(pCVar4->dpy,uVar3,&pCVar4->index,1,0);
    }
    operator_delete(pCVar4);
    pCVar4 = pCVar2;
  }
  this->color_head = (Color_Index *)0x0;
  remove((char *)this);
  Am_Image_Array::~Am_Image_Array(&this->stipple_bitmap);
  return;
}

Assistant:

Am_Style_Data::~Am_Style_Data()
{
  if (color_name && color_allocated)
    delete[] color_name;
  if (dash_list)
    delete[] dash_list;
  if (main_display) {
    // BUG: X index deletion will not work properly if some application
    // has changed the default colormap.
    // I'm not sure that's actually a bug (af1x 12-6-95)
    if (color_allocated) {
      int screen_num = DefaultScreen(main_display);
      Colormap c = XDefaultColormap(main_display, screen_num);
      XFreeColors(main_display, c, &main_color.pixel, 1, 0);
      // simulate an array of length 1
    }
  }
  Color_Index *current = color_head;
  Color_Index *next = nullptr;
  while (current) {
    next = current->next;
    current->next = nullptr;
    if (current->dpy) {
      if (color_allocated) {
        int screen_num = DefaultScreen(current->dpy);
        Colormap c = XDefaultColormap(current->dpy, screen_num);
        XFreeColors(current->dpy, c, &current->index.pixel, 1, 0);
        // simulate an array of length 1
      }
    }
    delete current;
    current = next;
  }
  color_head = nullptr;
  remove(this);
}